

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

archive_string * archive_strncat(archive_string *as,void *_p,size_t n)

{
  archive_string *paVar1;
  bool bVar2;
  char *local_38;
  char *pp;
  char *p;
  size_t s;
  size_t n_local;
  void *_p_local;
  archive_string *as_local;
  
  p = (char *)0x0;
  local_38 = (char *)_p;
  while( true ) {
    bVar2 = false;
    if (p < n) {
      bVar2 = *local_38 != '\0';
    }
    if (!bVar2) break;
    local_38 = local_38 + 1;
    p = p + 1;
  }
  paVar1 = archive_string_append(as,(char *)_p,(size_t)p);
  if (paVar1 == (archive_string *)0x0) {
    __archive_errx(1,"Out of memory");
  }
  return paVar1;
}

Assistant:

struct archive_string *
archive_strncat(struct archive_string *as, const void *_p, size_t n)
{
	size_t s;
	const char *p, *pp;

	p = (const char *)_p;

	/* Like strlen(p), except won't examine positions beyond p[n]. */
	s = 0;
	pp = p;
	while (s < n && *pp) {
		pp++;
		s++;
	}
	if ((as = archive_string_append(as, p, s)) == NULL)
		__archive_errx(1, "Out of memory");
	return (as);
}